

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::GetCV(ON_NurbsCurve *this,int i,point_style style,double *Point)

{
  double *__src;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  
  if (this->m_cv == (double *)0x0) {
    return false;
  }
  __src = this->m_cv + i * this->m_cv_stride;
  iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (this->m_is_rat == 0) {
    dVar5 = 1.0;
  }
  else {
    dVar5 = __src[iVar2];
  }
  switch(style) {
  case homogeneous_rational:
    uVar3 = (ulong)iVar2;
    Point[uVar3] = dVar5;
    goto LAB_0053c9c2;
  case euclidean_rational:
    Point[iVar2] = dVar5;
  case not_rational:
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      bVar1 = true;
      if (iVar2 != 0) {
        lVar4 = 0;
        do {
          Point[lVar4] = __src[lVar4] * (1.0 / dVar5);
          lVar4 = lVar4 + 1;
        } while (iVar2 != (int)lVar4);
      }
    }
    else {
switchD_0053c98b_default:
      bVar1 = false;
    }
    break;
  case intrinsic_point_style:
    uVar3 = 0;
    if (0 < this->m_dim) {
      uVar3 = (ulong)((this->m_dim + 1) - (uint)(this->m_is_rat == 0));
    }
LAB_0053c9c2:
    memcpy(Point,__src,uVar3 << 3);
    bVar1 = true;
    break;
  default:
    goto switchD_0053c98b_default;
  }
  return bVar1;
}

Assistant:

double* ON_NurbsCurve::CV( int i ) const
{
  return (m_cv) ? (m_cv + i*m_cv_stride) : nullptr;
}